

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::ktx_texture::read_from_stream(ktx_texture *this,data_stream_serializer *serializer)

{
  uint *puVar1;
  uint32 uVar2;
  uint32 uVar3;
  vector<unsigned_char> *pvVar4;
  bool bVar5;
  uint slice_size;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong extraout_RAX;
  ulong uVar11;
  ulong *puVar12;
  byte bVar13;
  char cVar14;
  uint actual_size_3;
  uint uVar15;
  uint uVar16;
  uint32 uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  uint actual_size;
  uint uVar23;
  uint uVar24;
  vector<unsigned_char> *pvVar25;
  bool bVar26;
  char cVar27;
  uint32 key_value_byte_size;
  uint8_vec key_value_data;
  uint8 pad_bytes [3];
  uint local_84;
  uint local_80;
  char local_79;
  vector<unsigned_char> local_78;
  data_stream_serializer *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  undefined4 local_48;
  uint local_44;
  uint local_40;
  undefined1 local_3b [3];
  vector<crnlib::vector<unsigned_char>_> *local_38;
  undefined4 extraout_var;
  
  clear(this);
  local_68 = serializer;
  iVar6 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,this,0x40);
  if (((iVar6 == 0x40) &&
      (*(int *)((this->m_header).m_identifier + 8) == 0xa1a0a0d &&
       *(long *)(this->m_header).m_identifier == -0x44cecedfa7abb455)) &&
     ((uVar17 = (this->m_header).m_endianness, uVar17 == 0x4030201 || (uVar17 == 0x1020304)))) {
    this->m_opposite_endianness = uVar17 == 0x1020304;
    if (uVar17 == 0x1020304) {
      lVar9 = 3;
      do {
        uVar15 = *(uint *)((this->m_header).m_identifier + lVar9 * 4);
        *(uint *)((this->m_header).m_identifier + lVar9 * 4) =
             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x10);
      uVar15 = (this->m_header).m_glTypeSize;
      if (4 < uVar15) {
        return false;
      }
      if ((0x16U >> (uVar15 & 0x1f) & 1) == 0) {
        return false;
      }
    }
    bVar5 = check_header(this);
    if (bVar5) {
      bVar5 = compute_pixel_info(this);
      if (!bVar5) {
        return false;
      }
      uVar15 = (this->m_header).m_bytesOfKeyValueData;
      do {
        if (uVar15 == 0) {
          local_5c = (this->m_header).m_numberOfMipmapLevels;
          local_80 = local_5c + (local_5c == 0);
          uVar17 = (this->m_header).m_pixelDepth;
          uVar2 = (this->m_header).m_numberOfArrayElements;
          iVar6 = uVar2 + (uVar2 == 0);
          uVar3 = (this->m_header).m_numberOfFaces;
          local_54 = uVar17 + (uVar17 == 0);
          local_50 = 0;
          if (uVar3 * local_54 * iVar6 * local_80 - 0x10000 < 0xffff0001) goto LAB_0018fb8c;
          local_40 = (this->m_header).m_pixelWidth;
          uVar17 = (this->m_header).m_pixelHeight;
          uVar15 = this->m_block_dim;
          if (uVar15 <= -local_40) {
            local_50 = 0;
            if (-(uint)(uVar17 == 0) - uVar17 < uVar15) goto LAB_0018fb8c;
            local_58 = uVar17 + (uVar17 == 0);
            local_38 = (vector<crnlib::vector<unsigned_char>_> *)
                       CONCAT71(local_38._1_7_,uVar2 == 0 && uVar3 == 6);
            local_44 = this->m_bytes_per_block;
            uVar22 = 0;
            bVar5 = true;
            uVar7 = 0;
            goto LAB_0018faa3;
          }
          break;
        }
        if (uVar15 < 4) break;
        iVar6 = (*local_68->m_pStream->_vptr_data_stream[4])(local_68->m_pStream,&local_84,4);
        if (iVar6 == 4) {
          if (this->m_opposite_endianness == true) {
            local_84 = local_84 >> 0x18 | (local_84 & 0xff0000) >> 8 | (local_84 & 0xff00) << 8 |
                       local_84 << 0x18;
          }
          uVar7 = local_84;
          uVar15 = uVar15 - 4;
          if (uVar15 < local_84) goto LAB_0018f87b;
          local_78.m_p = (uchar *)0x0;
          local_78.m_size = 0;
          local_78.m_capacity = 0;
          if (local_84 == 0) {
LAB_0018f90b:
            uVar7 = (this->m_key_values).m_size;
            if ((this->m_key_values).m_capacity <= uVar7) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_key_values,uVar7 + 1,true,0x10,
                         (object_mover)0x0,false);
            }
            pvVar4 = (this->m_key_values).m_p;
            uVar7 = (this->m_key_values).m_size;
            pvVar25 = pvVar4 + uVar7;
            pvVar4 = pvVar4 + uVar7;
            pvVar4->m_p = (uchar *)0x0;
            pvVar4->m_size = 0;
            pvVar4->m_capacity = 0;
            elemental_vector::increase_capacity
                      ((elemental_vector *)pvVar25,local_78.m_size,false,1,(object_mover)0x0,false);
            pvVar25->m_size = local_78.m_size;
            memcpy(pvVar25->m_p,local_78.m_p,local_78._8_8_ & 0xffffffff);
            puVar1 = &(this->m_key_values).m_size;
            *puVar1 = *puVar1 + 1;
            uVar7 = local_84 - 1 & 3;
            uVar23 = uVar7 ^ 3;
            if ((uVar7 != 3) &&
               (uVar7 = (*local_68->m_pStream->_vptr_data_stream[4])
                                  (local_68->m_pStream,local_3b,(ulong)uVar23), uVar7 != uVar23))
            goto LAB_0018f9c1;
            bVar5 = uVar23 <= uVar15 - local_84;
            if (!bVar5) {
              uVar23 = 0;
            }
            uVar15 = (uVar15 - local_84) - uVar23;
          }
          else {
            if (local_84 != 0) {
              if (local_84 != 0) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)&local_78,local_84,local_84 == 1,1,(object_mover)0x0,
                           false);
              }
              memset(local_78.m_p + (local_78._8_8_ & 0xffffffff),0,(ulong)(uVar7 - local_78.m_size)
                    );
              local_78.m_size = uVar7;
            }
            if (local_84 == 0) {
              uVar7 = 0;
            }
            else {
              uVar7 = (*local_68->m_pStream->_vptr_data_stream[4])(local_68->m_pStream,local_78.m_p)
              ;
            }
            if (uVar7 == local_84) goto LAB_0018f90b;
LAB_0018f9c1:
            bVar5 = false;
          }
          if (local_78.m_p != (uchar *)0x0) {
            crnlib_free(local_78.m_p);
          }
        }
        else {
LAB_0018f87b:
          bVar5 = false;
        }
      } while (bVar5);
      local_50 = 0;
      goto LAB_0018fb8c;
    }
  }
  return false;
  while( true ) {
    uVar7 = uVar7 + 1;
    bVar5 = uVar7 < local_5c;
    if (uVar7 == local_80) break;
LAB_0018faa3:
    bVar13 = (byte)uVar7;
    uVar16 = local_40 >> (bVar13 & 0x1f);
    uVar23 = local_58 >> (bVar13 & 0x1f);
    uVar19 = local_54 >> (bVar13 & 0x1f);
    iVar20 = uVar19 + (uVar19 == 0);
    uVar16 = uVar16 + (uVar16 == 0) + (uVar15 - 1);
    uVar23 = uVar23 + (uVar23 == 0) + (uVar15 - 1);
    if (uVar23 >= uVar15 && uVar16 >= uVar15) {
      uVar22 = uVar22 + 4;
      uVar19 = (uVar16 / uVar15) * (uVar23 / uVar15) * local_44;
      if (uVar2 == 0 && uVar3 == 6) {
        uVar17 = uVar3;
        do {
          uVar22 = uVar22 + uVar19 + (ulong)(-uVar19 & 3);
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      else {
        iVar18 = 0;
        uVar24 = 0;
        do {
          if (uVar3 != 0) {
            uVar17 = 0;
            iVar21 = iVar20;
            do {
              do {
                uVar24 = uVar24 + uVar19;
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
              uVar17 = uVar17 + 1;
              iVar21 = iVar20;
            } while (uVar17 != uVar3);
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar6);
        uVar22 = uVar22 + uVar24 + (ulong)(-uVar24 & 3);
      }
    }
    if (uVar23 < uVar15 || uVar16 < uVar15) break;
  }
  if (bVar5) {
    local_79 = '\x01';
    local_48 = 0;
  }
  else {
    iVar6 = (*local_68->m_pStream->_vptr_data_stream[10])();
    uVar10 = CONCAT44(extraout_var,iVar6);
    local_79 = uVar22 <= uVar10;
    uVar11 = uVar10;
    if (!(bool)local_79) {
      console::warning(
                      "ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields"
                      );
      uVar11 = extraout_RAX;
    }
    local_48 = (undefined4)CONCAT71((int7)(uVar11 >> 8),uVar10 < uVar22);
  }
  local_50 = 0;
  if (!bVar5) {
    local_38 = &this->m_image_data;
    uVar15 = 0;
    do {
      bVar13 = (byte)uVar15;
      uVar23 = (this->m_header).m_pixelWidth >> (bVar13 & 0x1f);
      uVar17 = (this->m_header).m_pixelHeight;
      uVar16 = uVar17 + (uVar17 == 0) >> (bVar13 & 0x1f);
      uVar17 = (this->m_header).m_pixelDepth;
      local_40 = uVar17 + (uVar17 == 0) >> (bVar13 & 0x1f);
      local_54 = local_40 + (local_40 == 0);
      uVar7 = this->m_block_dim;
      uVar19 = (uVar7 + uVar23 + (uVar23 == 0)) - 1;
      uVar24 = uVar19 / uVar7;
      uVar16 = (uVar7 + uVar16 + (uVar16 == 0)) - 1;
      uVar23 = uVar16 / uVar7;
      cVar27 = '\x01';
      if ((uVar7 <= uVar19) && (uVar7 <= uVar16)) {
        local_84 = 0;
        if (local_79 == '\0') {
          uVar17 = (this->m_header).m_numberOfArrayElements;
          local_84 = uVar23 * uVar24 * local_54 * this->m_bytes_per_block * (uVar17 + (uVar17 == 0))
                     * (this->m_header).m_numberOfFaces;
        }
        else {
          iVar6 = (*local_68->m_pStream->_vptr_data_stream[4])(local_68->m_pStream,&local_84,4);
          cVar27 = '\x01';
          if (iVar6 != 4) goto LAB_0019009c;
          if (this->m_opposite_endianness == true) {
            local_84 = local_84 >> 0x18 | (local_84 & 0xff0000) >> 8 | (local_84 & 0xff00) << 8 |
                       local_84 << 0x18;
          }
        }
        cVar27 = '\x01';
        local_60 = uVar15;
        if (local_84 != 0) {
          if (((this->m_header).m_numberOfArrayElements == 0) &&
             ((this->m_header).m_numberOfFaces == 6)) {
            bVar26 = (this->m_header).m_numberOfFaces == 0;
            bVar5 = !bVar26;
            cVar27 = '\x16';
            if (bVar26) {
              local_80 = 0;
            }
            else {
              uVar15 = 0;
              local_80 = 0;
              do {
                local_78.m_p = (uchar *)0x0;
                local_78.m_size = 0;
                local_78.m_capacity = 0;
                vector<crnlib::vector<unsigned_char>_>::push_back(local_38,&local_78);
                vector<unsigned_char>::~vector(&local_78);
                pvVar25 = (this->m_image_data).m_p + ((this->m_image_data).m_size - 1);
                uVar8 = 0;
                vector<unsigned_char>::resize(pvVar25,local_84,false);
                if (local_84 != 0) {
                  uVar8 = (*local_68->m_pStream->_vptr_data_stream[4])
                                    (local_68->m_pStream,pvVar25->m_p);
                }
                if (uVar8 == local_84) {
                  if (this->m_opposite_endianness == true) {
                    utils::endian_swap_mem(pvVar25->m_p,local_84,(this->m_header).m_glTypeSize);
                  }
                  uVar7 = 0;
                  uVar23 = -local_84 & 3;
                  if ((char)local_48 != '\0') {
                    uVar23 = 0;
                  }
                  if (uVar23 != 0) {
                    uVar7 = (*local_68->m_pStream->_vptr_data_stream[4])
                                      (local_68->m_pStream,local_3b,(ulong)uVar23);
                  }
                  iVar6 = local_84 + uVar23;
                  bVar26 = uVar7 == uVar23;
                  if (!bVar26) {
                    iVar6 = 0;
                  }
                  local_80 = local_80 + iVar6;
                }
                else {
                  bVar26 = false;
                }
                if (!bVar26) {
                  cVar27 = '\x01';
                  break;
                }
                uVar15 = uVar15 + 1;
                bVar5 = uVar15 < (this->m_header).m_numberOfFaces;
              } while (bVar5);
            }
            bVar5 = !bVar5;
          }
          else {
            uVar23 = uVar23 * uVar24;
            uVar7 = 0;
            local_80 = 0;
            uVar15 = local_84;
            local_58 = uVar23;
            do {
              cVar14 = '\x1c';
              if ((this->m_header).m_numberOfFaces != 0) {
                uVar16 = 0;
                local_5c = uVar7;
                do {
                  bVar5 = true;
                  uVar7 = 0;
                  local_44 = uVar16;
                  do {
                    uVar16 = this->m_bytes_per_block * uVar23;
                    if (uVar16 - 1 < uVar15) {
                      local_78.m_p = (uchar *)0x0;
                      local_78.m_size = 0;
                      local_78.m_capacity = 0;
                      uVar23 = (this->m_image_data).m_size;
                      if ((this->m_image_data).m_capacity <= uVar23) {
                        elemental_vector::increase_capacity
                                  ((elemental_vector *)local_38,uVar23 + 1,true,0x10,
                                   (object_mover)0x0,false);
                      }
                      pvVar4 = (this->m_image_data).m_p;
                      uVar23 = (this->m_image_data).m_size;
                      pvVar25 = pvVar4 + uVar23;
                      pvVar4 = pvVar4 + uVar23;
                      pvVar4->m_p = (uchar *)0x0;
                      pvVar4->m_size = 0;
                      pvVar4->m_capacity = 0;
                      elemental_vector::increase_capacity
                                ((elemental_vector *)pvVar25,local_78.m_size,false,1,
                                 (object_mover)0x0,false);
                      pvVar25->m_size = local_78.m_size;
                      memcpy(pvVar25->m_p,local_78.m_p,local_78._8_8_ & 0xffffffff);
                      puVar1 = &(this->m_image_data).m_size;
                      *puVar1 = *puVar1 + 1;
                      if (local_78.m_p != (uchar *)0x0) {
                        crnlib_free(local_78.m_p);
                      }
                      pvVar4 = (this->m_image_data).m_p;
                      uVar23 = (this->m_image_data).m_size - 1;
                      pvVar25 = pvVar4 + uVar23;
                      uVar23 = pvVar4[uVar23].m_size;
                      if (uVar23 != uVar16) {
                        if (uVar23 <= uVar16) {
                          if (pvVar25->m_capacity < uVar16) {
                            elemental_vector::increase_capacity
                                      ((elemental_vector *)pvVar25,uVar16,uVar23 + 1 == uVar16,1,
                                       (object_mover)0x0,false);
                          }
                          memset(pvVar25->m_p + pvVar25->m_size,0,(ulong)(uVar16 - pvVar25->m_size))
                          ;
                        }
                        pvVar25->m_size = uVar16;
                      }
                      uVar23 = (*local_68->m_pStream->_vptr_data_stream[4])
                                         (local_68->m_pStream,pvVar25->m_p,(ulong)uVar16);
                      bVar26 = uVar23 == uVar16;
                      uVar23 = local_58;
                      if (bVar26) {
                        if (this->m_opposite_endianness == true) {
                          puVar12 = (ulong *)pvVar25->m_p;
                          uVar17 = (this->m_header).m_glTypeSize;
                          if (uVar17 == 8) {
                            if (7 < uVar16) {
                              uVar19 = uVar16 >> 3;
                              do {
                                uVar22 = *puVar12;
                                *puVar12 = uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                                           (uVar22 & 0xff0000000000) >> 0x18 |
                                           (uVar22 & 0xff00000000) >> 8 | (uVar22 & 0xff000000) << 8
                                           | (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28
                                           | uVar22 << 0x38;
                                puVar12 = puVar12 + 1;
                                uVar19 = uVar19 - 1;
                              } while (uVar19 != 0);
                            }
                          }
                          else if (uVar17 == 4) {
                            if (3 < uVar16) {
                              uVar19 = uVar16 >> 2;
                              do {
                                uVar24 = (uint)*puVar12;
                                *(uint *)puVar12 =
                                     uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 |
                                     (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
                                puVar12 = (ulong *)((long)puVar12 + 4);
                                uVar19 = uVar19 - 1;
                              } while (uVar19 != 0);
                            }
                          }
                          else if ((uVar17 == 2) && (1 < uVar16)) {
                            uVar19 = uVar16 >> 1;
                            do {
                              *(ushort *)puVar12 = (ushort)*puVar12 << 8 | (ushort)*puVar12 >> 8;
                              puVar12 = (ulong *)((long)puVar12 + 2);
                              uVar19 = uVar19 - 1;
                            } while (uVar19 != 0);
                          }
                        }
                        uVar15 = uVar15 - uVar16;
                        local_80 = local_80 + uVar16;
                        bVar26 = true;
                      }
                    }
                    else {
                      bVar26 = false;
                    }
                    if (!bVar26) {
                      cVar14 = '\x01';
                      goto LAB_0018fff5;
                    }
                    uVar7 = uVar7 + 1;
                    bVar5 = uVar7 < local_40;
                  } while (uVar7 != local_54);
                  cVar14 = '\x1f';
LAB_0018fff5:
                  uVar7 = local_5c;
                  if (bVar5) goto LAB_00190023;
                  uVar16 = local_44 + 1;
                } while (uVar16 < (this->m_header).m_numberOfFaces);
                cVar14 = '\x1c';
              }
LAB_00190023:
              if (cVar14 != '\x1c') goto LAB_00190039;
              uVar7 = uVar7 + 1;
            } while (uVar7 < (this->m_header).m_numberOfArrayElements);
            cVar14 = '\x19';
LAB_00190039:
            cVar27 = uVar15 != 0;
            if (cVar14 != '\x19') {
              cVar27 = cVar14;
            }
            bVar5 = cVar27 == '\0';
          }
          uVar15 = local_60;
          if (bVar5) {
            uVar23 = -local_80 & 3;
            uVar7 = 0;
            if ((char)local_48 != '\0') {
              uVar23 = 0;
            }
            if (uVar23 != 0) {
              uVar7 = (*local_68->m_pStream->_vptr_data_stream[4])
                                (local_68->m_pStream,local_3b,(ulong)uVar23);
            }
            cVar27 = uVar7 != uVar23;
          }
        }
      }
LAB_0019009c:
      if (cVar27 != '\0') goto LAB_001900b1;
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this->m_header).m_numberOfMipmapLevels);
    cVar27 = '\x13';
LAB_001900b1:
    local_50 = (ulong)(cVar27 == '\x13');
  }
LAB_0018fb8c:
  return SUB81(local_50,0);
}

Assistant:

bool ktx_texture::read_from_stream(data_stream_serializer& serializer)
    {
        clear();

        // Read header
        if (serializer.read(&m_header, 1, sizeof(m_header)) != sizeof(ktx_header))
        {
            return false;
        }

        // Check header
        if (memcmp(s_ktx_file_id, m_header.m_identifier, sizeof(m_header.m_identifier)))
        {
            return false;
        }

        if ((m_header.m_endianness != KTX_OPPOSITE_ENDIAN) && (m_header.m_endianness != KTX_ENDIAN))
        {
            return false;
        }

        m_opposite_endianness = (m_header.m_endianness == KTX_OPPOSITE_ENDIAN);
        if (m_opposite_endianness)
        {
            m_header.endian_swap();

            if ((m_header.m_glTypeSize != sizeof(uint8)) && (m_header.m_glTypeSize != sizeof(uint16)) && (m_header.m_glTypeSize != sizeof(uint32)))
            {
                return false;
            }
        }

        if (!check_header())
        {
            return false;
        }

        if (!compute_pixel_info())
        {
            return false;
        }

        uint8 pad_bytes[3];

        // Read the key value entries
        uint num_key_value_bytes_remaining = m_header.m_bytesOfKeyValueData;
        while (num_key_value_bytes_remaining)
        {
            if (num_key_value_bytes_remaining < sizeof(uint32))
            {
                return false;
            }

            uint32 key_value_byte_size;
            if (serializer.read(&key_value_byte_size, 1, sizeof(uint32)) != sizeof(uint32))
            {
                return false;
            }

            num_key_value_bytes_remaining -= sizeof(uint32);

            if (m_opposite_endianness)
            {
                key_value_byte_size = utils::swap32(key_value_byte_size);
            }

            if (key_value_byte_size > num_key_value_bytes_remaining)
            {
                return false;
            }

            uint8_vec key_value_data;
            if (key_value_byte_size)
            {
                key_value_data.resize(key_value_byte_size);
                if (serializer.read(&key_value_data[0], 1, key_value_byte_size) != key_value_byte_size)
                {
                    return false;
                }
            }

            m_key_values.push_back(key_value_data);

            uint padding = 3 - ((key_value_byte_size + 3) % 4);
            if (padding)
            {
                if (serializer.read(pad_bytes, 1, padding) != padding)
                {
                    return false;
                }
            }

            num_key_value_bytes_remaining -= key_value_byte_size;
            if (num_key_value_bytes_remaining < padding)
            {
                return false;
            }
            num_key_value_bytes_remaining -= padding;
        }

        // Now read the mip levels
        uint total_faces = get_num_mips() * get_array_size() * get_num_faces() * get_depth();
        if ((!total_faces) || (total_faces > 65535))
        {
            return false;
        }

// See Section 2.8 of KTX file format: No rounding to block sizes should be applied for block compressed textures.
// OK, I'm going to break that rule otherwise KTX can only store a subset of textures that DDS can handle for no good reason.
#if 0
      const uint mip0_row_blocks = m_header.m_pixelWidth / m_block_dim;
      const uint mip0_col_blocks = CRNLIB_MAX(1, m_header.m_pixelHeight) / m_block_dim;
#else
        const uint mip0_row_blocks = (m_header.m_pixelWidth + m_block_dim - 1) / m_block_dim;
        const uint mip0_col_blocks = (CRNLIB_MAX(1, m_header.m_pixelHeight) + m_block_dim - 1) / m_block_dim;
#endif
        if ((!mip0_row_blocks) || (!mip0_col_blocks))
        {
            return false;
        }

        bool has_valid_image_size_fields = true;
        bool disable_mip_and_cubemap_padding = false;

#if CRNLIB_KTX_PVRTEX_WORKAROUNDS
        {
            // PVRTexTool has a bogus KTX writer that doesn't write any imageSize fields. Nice.
            size_t expected_bytes_remaining = 0;
            for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
            {
                uint mip_width, mip_height, mip_depth;
                get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

                const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
                const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
                if ((!mip_row_blocks) || (!mip_col_blocks))
                {
                    return false;
                }

                expected_bytes_remaining += sizeof(uint32);

                if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        expected_bytes_remaining += slice_size;

                        uint num_cube_pad_bytes = 3 - ((slice_size + 3) % 4);
                        expected_bytes_remaining += num_cube_pad_bytes;
                    }
                }
                else
                {
                    uint total_mip_size = 0;
                    for (uint array_element = 0; array_element < get_array_size(); array_element++)
                    {
                        for (uint face = 0; face < get_num_faces(); face++)
                        {
                            for (uint zslice = 0; zslice < mip_depth; zslice++)
                            {
                                uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                                total_mip_size += slice_size;
                            }
                        }
                    }
                    expected_bytes_remaining += total_mip_size;

                    uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
                    expected_bytes_remaining += num_mip_pad_bytes;
                }
            }

            if (serializer.get_stream()->get_remaining() < expected_bytes_remaining)
            {
                has_valid_image_size_fields = false;
                disable_mip_and_cubemap_padding = true;
                console::warning("ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields");
            }
        }
#endif

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            uint32 image_size = 0;
            if (!has_valid_image_size_fields)
            {
                image_size = mip_depth * mip_row_blocks * mip_col_blocks * m_bytes_per_block * get_array_size() * get_num_faces();
            }
            else
            {
                if (serializer.read(&image_size, 1, sizeof(image_size)) != sizeof(image_size))
                {
                    return false;
                }

                if (m_opposite_endianness)
                {
                    image_size = utils::swap32(image_size);
                }
            }

            if (!image_size)
            {
                return false;
            }

            uint total_mip_size = 0;

            if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
            {
                // plain non-array cubemap
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, 0, face, 0));

                    m_image_data.push_back(uint8_vec());
                    uint8_vec& image_data = m_image_data.back();

                    image_data.resize(image_size);
                    if (serializer.read(&image_data[0], 1, image_size) != image_size)
                    {
                        return false;
                    }

                    if (m_opposite_endianness)
                    {
                        utils::endian_swap_mem(&image_data[0], image_size, m_header.m_glTypeSize);
                    }

                    uint num_cube_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((image_size + 3) % 4));
                    if (serializer.read(pad_bytes, 1, num_cube_pad_bytes) != num_cube_pad_bytes)
                    {
                        return false;
                    }

                    total_mip_size += image_size + num_cube_pad_bytes;
                }
            }
            else
            {
                // 1D, 2D, 3D (normal or array texture), or array cubemap
                uint num_image_bytes_remaining = image_size;

                for (uint array_element = 0; array_element < get_array_size(); array_element++)
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        for (uint zslice = 0; zslice < mip_depth; zslice++)
                        {
                            CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, array_element, face, zslice));

                            uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                            if ((!slice_size) || (slice_size > num_image_bytes_remaining))
                            {
                                return false;
                            }

                            m_image_data.push_back(uint8_vec());
                            uint8_vec& image_data = m_image_data.back();

                            image_data.resize(slice_size);
                            if (serializer.read(&image_data[0], 1, slice_size) != slice_size)
                            {
                                return false;
                            }

                            if (m_opposite_endianness)
                            {
                                utils::endian_swap_mem(&image_data[0], slice_size, m_header.m_glTypeSize);
                            }

                            num_image_bytes_remaining -= slice_size;

                            total_mip_size += slice_size;
                        }
                    }
                }

                if (num_image_bytes_remaining)
                {
                    return false;
                }
            }

            uint num_mip_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((total_mip_size + 3) % 4));
            if (serializer.read(pad_bytes, 1, num_mip_pad_bytes) != num_mip_pad_bytes)
            {
                return false;
            }
        }
        return true;
    }